

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.cpp
# Opt level: O2

int __thiscall csv::CSVReader::index_of(CSVReader *this,string_view col_name)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _col_names;
  
  get_col_names_abi_cxx11_(&_col_names,this);
  lVar3 = 8;
  uVar4 = 0;
  iVar2 = -1;
  do {
    if ((ulong)((long)_col_names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)_col_names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar4) {
LAB_00109bed:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&_col_names);
      return iVar2;
    }
    __x._M_str = *(char **)((long)_col_names.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar3 + -8);
    __x._M_len = *(size_t *)
                  ((long)&((_col_names.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar3);
    bVar1 = std::operator==(__x,col_name);
    if (bVar1) {
      iVar2 = (int)uVar4;
      goto LAB_00109bed;
    }
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x20;
  } while( true );
}

Assistant:

CSV_INLINE int CSVReader::index_of(csv::string_view col_name) const {
        auto _col_names = this->get_col_names();
        for (size_t i = 0; i < _col_names.size(); i++)
            if (_col_names[i] == col_name) return (int)i;

        return CSV_NOT_FOUND;
    }